

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O0

int conn_send_to(conn_handle *conn,uint8_t *buff,size_t buff_len,uint32_t addr,uint16_t port)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int local_4c;
  undefined1 local_48 [4];
  int ret;
  sockaddr_in saddr;
  conn_priv *priv;
  uint16_t port_local;
  size_t sStack_28;
  uint32_t addr_local;
  size_t buff_len_local;
  uint8_t *buff_local;
  conn_handle *conn_local;
  
  saddr.sin_zero = (uchar  [8])conn->priv;
  if (conn->type == CONN_TYPE_UDP) {
    memset(local_48,0,0x10);
    local_48._0_2_ = 2;
    local_48._2_2_ = htons(port);
    ret = addr;
    mutex_lock_shared((mutex_handle *)((long)saddr.sin_zero + 0x90));
    sStack_28 = buff_len;
    if (*(int *)((long)saddr.sin_zero + 8) == -1) {
      local_4c = -0x6b;
    }
    else {
      for (; sStack_28 != 0; sStack_28 = sStack_28 - (long)iVar1) {
        sVar2 = sendto(*(int *)((long)saddr.sin_zero + 8),buff,sStack_28 & 0xffffffff,0x4000,
                       (sockaddr *)local_48,0x10);
        iVar1 = (int)sVar2;
        if (iVar1 == 0) {
          local_4c = -0x20;
          goto LAB_00104431;
        }
        if (iVar1 == -1) {
          piVar3 = __errno_location();
          local_4c = -*piVar3;
          goto LAB_00104431;
        }
      }
      local_4c = 0;
    }
LAB_00104431:
    mutex_unlock_shared((mutex_handle *)((long)saddr.sin_zero + 0x90));
    conn_local._4_4_ = local_4c;
  }
  else {
    conn_local._4_4_ = -0x5b;
  }
  return conn_local._4_4_;
}

Assistant:

int conn_send_to(struct conn_handle *conn, const uint8_t *buff,
		 size_t buff_len, uint32_t addr, uint16_t port)
{
	struct conn_priv *priv = conn->priv;
	struct sockaddr_in saddr;
	int ret;

	if (conn->type != CONN_TYPE_UDP)
		return -EPROTOTYPE;

	memset(&saddr, 0x0, sizeof(saddr));

	saddr.sin_family = AF_INET;
	saddr.sin_port = htons(port);
	saddr.sin_addr.s_addr = addr;

	mutex_lock_shared(&priv->mutex);

	if (priv->fd != INVALID_SOCKET) {
		while (buff_len > 0) {
			/*! @TODO Bug? buff isn't changed */
			ret = sendto(priv->fd, (const char *)buff,
				     (socklen_t)buff_len, MSG_NOSIGNAL,
				     (struct sockaddr *)&saddr,
				     sizeof(saddr));

			if (ret == 0) {
				ret = -EPIPE;

				goto conn_send_to_exit;
			} else if (ret == SOCKET_ERROR) {
				ret = SOCK_ERRNO;

#ifdef _WIN32
				if (ret == -WSAESHUTDOWN)
					ret = -EPIPE;

#endif
				goto conn_send_to_exit;
			}

			buff_len -= ret;
		}

		ret = 0;
	} else {
		ret = -ENOTCONN;
	}

conn_send_to_exit:
	mutex_unlock_shared(&priv->mutex);

	return ret;
}